

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StructureAnalyzer.cpp
# Opt level: O2

void __thiscall dg::vr::StructureAnalyzer::findLoops(StructureAnalyzer *this)

{
  _Rb_tree_header *p_Var1;
  long lVar2;
  long lVar3;
  VRLocation *this_00;
  VRLocation *pVVar4;
  pointer puVar5;
  long lVar6;
  char cVar7;
  bool bVar8;
  iterator iVar9;
  long *plVar10;
  size_t i;
  ulong uVar11;
  DFSIt<dg::vr::VRCodeGraph::LazyVisit> *this_01;
  Function *f;
  pair<std::_Rb_tree_iterator<std::pair<const_dg::vr::VRLocation_*const,_std::vector<const_llvm::Instruction_*,_std::allocator<const_llvm::Instruction_*>_>_>_>,_bool>
  pVar12;
  LazyDFS it_1;
  VREdge *edge;
  set<dg::vr::VRLocation_*,_std::less<dg::vr::VRLocation_*>,_std::allocator<dg::vr::VRLocation_*>_>
  backwardReach;
  LazyDFS it;
  Instruction *local_170;
  DFSIt<dg::vr::VRCodeGraph::LazyVisit> local_168;
  _Head_base<0UL,_dg::vr::VREdge_*,_false> local_110;
  _Rb_tree<dg::vr::VRLocation_*,_dg::vr::VRLocation_*,_std::_Identity<dg::vr::VRLocation_*>,_std::less<dg::vr::VRLocation_*>,_std::allocator<dg::vr::VRLocation_*>_>
  local_b8;
  LazyDFS local_88;
  
  lVar2 = *(long *)this;
  plVar10 = (long *)(lVar2 + 0x20);
  while( true ) {
    lVar3 = *plVar10;
    if (lVar3 == lVar2 + 0x18) break;
    f = (Function *)(lVar3 + -0x38);
    if (lVar3 == 0) {
      f = (Function *)0x0;
    }
    cVar7 = llvm::GlobalValue::isDeclaration();
    if (cVar7 == '\0') {
      VRCodeGraph::lazy_dfs_begin(&local_88,*(VRCodeGraph **)(this + 8),f);
      while( true ) {
        VRCodeGraph::lazy_dfs_end();
        this_01 = &local_168;
        bVar8 = operator!=(&local_88,&local_168);
        VRCodeGraph::DFSIt<dg::vr::VRCodeGraph::LazyVisit>::~DFSIt(&local_168);
        if (!bVar8) break;
        this_00 = local_88.stack.
                  super__Vector_base<std::tuple<dg::vr::VRLocation_*,_unsigned_int,_dg::vr::VREdge_*>,_std::allocator<std::tuple<dg::vr::VRLocation_*,_unsigned_int,_dg::vr::VREdge_*>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish[-1].
                  super__Tuple_impl<0UL,_dg::vr::VRLocation_*,_unsigned_int,_dg::vr::VREdge_*>.
                  super__Head_base<0UL,_dg::vr::VRLocation_*,_false>._M_head_impl;
        bVar8 = VRLocation::isJustLoopJoin(this_00);
        if (bVar8) {
          collectBackward((set<dg::vr::VRLocation_*,_std::less<dg::vr::VRLocation_*>,_std::allocator<dg::vr::VRLocation_*>_>
                           *)&local_b8,(StructureAnalyzer *)this_01,f,this_00);
          local_168.super_LazyVisit.visited._M_t._M_impl._0_8_ = 0;
          local_168.super_LazyVisit.visited._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
               _S_red;
          local_168.super_LazyVisit.visited._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
          local_168.super_LazyVisit.visited._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
               (_Base_ptr)0x0;
          local_110._M_head_impl = (VREdge *)this_00;
          pVar12 = std::
                   _Rb_tree<dg::vr::VRLocation_const*,std::pair<dg::vr::VRLocation_const*const,std::vector<llvm::Instruction_const*,std::allocator<llvm::Instruction_const*>>>,std::_Select1st<std::pair<dg::vr::VRLocation_const*const,std::vector<llvm::Instruction_const*,std::allocator<llvm::Instruction_const*>>>>,std::less<dg::vr::VRLocation_const*>,std::allocator<std::pair<dg::vr::VRLocation_const*const,std::vector<llvm::Instruction_const*,std::allocator<llvm::Instruction_const*>>>>>
                   ::
                   _M_emplace_unique<dg::vr::VRLocation*,std::vector<llvm::Instruction_const*,std::allocator<llvm::Instruction_const*>>>
                             ((_Rb_tree<dg::vr::VRLocation_const*,std::pair<dg::vr::VRLocation_const*const,std::vector<llvm::Instruction_const*,std::allocator<llvm::Instruction_const*>>>,std::_Select1st<std::pair<dg::vr::VRLocation_const*const,std::vector<llvm::Instruction_const*,std::allocator<llvm::Instruction_const*>>>>,std::less<dg::vr::VRLocation_const*>,std::allocator<std::pair<dg::vr::VRLocation_const*const,std::vector<llvm::Instruction_const*,std::allocator<llvm::Instruction_const*>>>>>
                               *)(this + 0x10),(VRLocation **)&local_110,
                              (vector<const_llvm::Instruction_*,_std::allocator<const_llvm::Instruction_*>_>
                               *)&local_168);
          std::_Vector_base<const_llvm::Instruction_*,_std::allocator<const_llvm::Instruction_*>_>::
          ~_Vector_base((_Vector_base<const_llvm::Instruction_*,_std::allocator<const_llvm::Instruction_*>_>
                         *)&local_168);
          VRCodeGraph::lazy_dfs_begin(&local_168,*(VRCodeGraph **)(this + 8),f,this_00);
          while( true ) {
            VRCodeGraph::lazy_dfs_end();
            bVar8 = operator!=(&local_168,(DFSIt<dg::vr::VRCodeGraph::LazyVisit> *)&local_110);
            VRCodeGraph::DFSIt<dg::vr::VRCodeGraph::LazyVisit>::~DFSIt
                      ((DFSIt<dg::vr::VRCodeGraph::LazyVisit> *)&local_110);
            if (!bVar8) break;
            pVVar4 = local_168.stack.
                     super__Vector_base<std::tuple<dg::vr::VRLocation_*,_unsigned_int,_dg::vr::VREdge_*>,_std::allocator<std::tuple<dg::vr::VRLocation_*,_unsigned_int,_dg::vr::VREdge_*>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish[-1].
                     super__Tuple_impl<0UL,_dg::vr::VRLocation_*,_unsigned_int,_dg::vr::VREdge_*>.
                     super__Head_base<0UL,_dg::vr::VRLocation_*,_false>._M_head_impl;
            local_110._M_head_impl = (VREdge *)pVVar4;
            iVar9 = std::
                    _Rb_tree<dg::vr::VRLocation_*,_dg::vr::VRLocation_*,_std::_Identity<dg::vr::VRLocation_*>,_std::less<dg::vr::VRLocation_*>,_std::allocator<dg::vr::VRLocation_*>_>
                    ::find(&local_b8,(key_type *)&local_110);
            p_Var1 = &local_b8._M_impl.super__Rb_tree_header;
            if ((_Rb_tree_header *)iVar9._M_node != p_Var1) {
              for (uVar11 = 0;
                  puVar5 = (pVVar4->successors).
                           super__Vector_base<std::unique_ptr<dg::vr::VREdge,_std::default_delete<dg::vr::VREdge>_>,_std::allocator<std::unique_ptr<dg::vr::VREdge,_std::default_delete<dg::vr::VREdge>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start,
                  uVar11 < ((ulong)((long)(pVVar4->successors).
                                          super__Vector_base<std::unique_ptr<dg::vr::VREdge,_std::default_delete<dg::vr::VREdge>_>,_std::allocator<std::unique_ptr<dg::vr::VREdge,_std::default_delete<dg::vr::VREdge>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_finish - (long)puVar5)
                            >> 3 & 0xffffffff); uVar11 = uVar11 + 1) {
                local_110._M_head_impl =
                     *(VREdge **)
                      &puVar5[uVar11]._M_t.
                       super___uniq_ptr_impl<dg::vr::VREdge,_std::default_delete<dg::vr::VREdge>_>.
                       _M_t;
                if ((((ValueRelations *)((long)local_110._M_head_impl + 8))->graph).reported !=
                    (ValueRelations *)0x0) {
                  iVar9 = std::
                          _Rb_tree<dg::vr::VRLocation_*,_dg::vr::VRLocation_*,_std::_Identity<dg::vr::VRLocation_*>,_std::less<dg::vr::VRLocation_*>,_std::allocator<dg::vr::VRLocation_*>_>
                          ::find(&local_b8,(key_type *)((long)local_110._M_head_impl + 8));
                  if ((_Rb_tree_header *)iVar9._M_node == p_Var1) {
                    std::vector<dg::vr::VREdge_const*,std::allocator<dg::vr::VREdge_const*>>::
                    emplace_back<dg::vr::VREdge*&>
                              ((vector<dg::vr::VREdge_const*,std::allocator<dg::vr::VREdge_const*>>
                                *)&this_00->loopEnds,(VREdge **)&local_110);
                  }
                  else {
                    lVar6 = *(long *)&(((UniqueBucketSet *)&(local_110._M_head_impl)->op)->_M_t).
                                      _M_impl;
                    if (*(int *)(lVar6 + 8) == 1) {
                      local_170 = *(Instruction **)(lVar6 + 0x10);
                      std::vector<llvm::Instruction_const*,std::allocator<llvm::Instruction_const*>>
                      ::emplace_back<llvm::Instruction_const*>
                                ((vector<llvm::Instruction_const*,std::allocator<llvm::Instruction_const*>>
                                  *)&pVar12.first._M_node._M_node[1]._M_parent,&local_170);
                    }
                  }
                }
              }
              if ((pVVar4 != this_00) &&
                 ((pVVar4->join == (VRLocation *)0x0 || (this_00->join != (VRLocation *)0x0)))) {
                pVVar4->join = this_00;
              }
            }
            VRCodeGraph::DFSIt<dg::vr::VRCodeGraph::LazyVisit>::operator++(&local_168);
          }
          VRCodeGraph::DFSIt<dg::vr::VRCodeGraph::LazyVisit>::~DFSIt(&local_168);
          std::
          _Rb_tree<dg::vr::VRLocation_*,_dg::vr::VRLocation_*,_std::_Identity<dg::vr::VRLocation_*>,_std::less<dg::vr::VRLocation_*>,_std::allocator<dg::vr::VRLocation_*>_>
          ::~_Rb_tree(&local_b8);
        }
        VRCodeGraph::DFSIt<dg::vr::VRCodeGraph::LazyVisit>::operator++(&local_88);
      }
      VRCodeGraph::DFSIt<dg::vr::VRCodeGraph::LazyVisit>::~DFSIt(&local_88);
    }
    plVar10 = (long *)(lVar3 + 8);
  }
  return;
}

Assistant:

void StructureAnalyzer::findLoops() {
    for (const auto &function : module) {
        if (function.isDeclaration())
            continue;

        for (auto it = codeGraph.lazy_dfs_begin(function);
             it != codeGraph.lazy_dfs_end(); ++it) {
            VRLocation &location = *it;

            if (!location.isJustLoopJoin())
                continue;

            auto backwardReach = collectBackward(function, location);

            auto &loop =
                    inloopValues
                            .emplace(&location,
                                     std::vector<const llvm::Instruction *>())
                            .first->second;

            for (auto it = codeGraph.lazy_dfs_begin(function, location);
                 it != codeGraph.lazy_dfs_end(); ++it) {
                VRLocation &source = *it;

                if (backwardReach.find(&source) == backwardReach.end())
                    continue;

                for (size_t i = 0; i < source.succsSize(); ++i) {
                    VREdge *edge = source.getSuccEdge(i);
                    if (!edge->target)
                        continue;

                    if (backwardReach.find(edge->target) !=
                        backwardReach.end()) {
                        if (edge->op->isInstruction()) {
                            auto *op = static_cast<VRInstruction *>(
                                    edge->op.get());
                            loop.emplace_back(op->getInstruction());
                        }
                    } else
                        location.loopEnds.emplace_back(edge);
                }

                if (&source != &location && (!source.join || location.join))
                    source.join = &location;
            }
        }
    }
}